

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O0

size_t adios2sysEncoding_mbstowcs(wchar_t *dest,char *str,size_t n)

{
  size_t in_RDX;
  char *in_RSI;
  wchar_t *in_RDI;
  undefined8 local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = mbstowcs(in_RDI,in_RSI,in_RDX);
  }
  return local_8;
}

Assistant:

size_t kwsysEncoding_mbstowcs(wchar_t* dest, const char* str, size_t n)
{
  if (str == 0) {
    return (size_t)-1;
  }
#ifdef _WIN32
  return MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str, -1, dest,
                             (int)n) -
    1;
#else
  return mbstowcs(dest, str, n);
#endif
}